

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeKRMmatricesGlobal
          (ChElementHexaANCF_3813 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_e1;
  double local_e0;
  double local_d8;
  double local_d0;
  DstXprType local_c8;
  DstEvaluatorType local_90;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_78;
  SrcEvaluatorType local_58;
  
  local_e0 = Kfactor;
  local_d8 = Rfactor;
  local_d0 = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0x18) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0x18)) {
    __assert_fail("(H.rows() == 24) && (H.cols() == 24)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3813.cpp"
                  ,0x66d,
                  "virtual void chrono::fea::ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  ComputeStiffnessMatrix(this);
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_outerStride =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ((this->m_Material).
                  super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->damping_K;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_data = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_rows.m_value = 0x18;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_cols.m_value = 0x18;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_startRow.m_value = 0;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .m_xpr = H;
  if ((0x17 < (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value) &&
     (0x17 < (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_e0;
    local_58.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>)&this->m_MassMatrix;
    local_78.m_dst = &local_90;
    local_58.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>)&this->m_StiffnessMatrix;
    local_78.m_src = &local_58;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_d8;
    auVar2 = vfmadd132sd_fma(auVar2,auVar3,auVar1);
    local_78.m_dstExpr = &local_c8;
    local_58.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .m_functor.m_other = auVar2._0_8_;
    local_58.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
    .m_functor.m_other = local_d0;
    local_78.m_functor = &local_e1;
    local_90.
    super_block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = local_c8.
              super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
              .m_data;
    local_90.
    super_block_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value =
         local_c8.
         super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
         .m_outerStride;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_78);
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 24) && (H.cols() == 24));

    // Compute global stiffness matrix:
    ComputeStiffnessMatrix();

    // For K stiffness matrix and R matrix: scale by factors
    // because [R] = r*[K] , so kf*[K]+rf*[R] = (kf+rf*r)*[K]
    double kr_factor = Kfactor + Rfactor * m_Material->Get_RayleighDampingK();

    // Paste scaled K stiffness matrix and R matrix in resulting H and add scaled mass matrix.
    H.block(0, 0, 24, 24) = kr_factor * m_StiffnessMatrix + Mfactor * m_MassMatrix;
}